

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

omittable_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_> *
__thiscall
discordpp::
omittable_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>::
operator=(omittable_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>
          *this)

{
  std::
  __uniq_ptr_impl<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
           *)&this->
              super_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>
          ,(pointer)0x0);
  (this->super_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>)
  .s_ = omitted_e;
  return this;
}

Assistant:

virtual omittable_field &operator=(omitted_t) {
        field<T>::t_ = nullptr;
        field<T>::s_ = field<T>::omitted_e;
        return *this;
    }